

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O0

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  object_fns *poVar1;
  target_fns *ptVar2;
  any_executor_base *other_local;
  any_executor_base *this_local;
  
  this->object_fns_ = other->object_fns_;
  this->target_fns_ = other->target_fns_;
  poVar1 = object_fns_table<void>((type *)0x0);
  other->object_fns_ = poVar1;
  ptVar2 = target_fns_table<void>((type *)0x0);
  other->target_fns_ = ptVar2;
  (*this->object_fns_->move)(this,other);
  other->target_ = (void *)0x0;
  return;
}

Assistant:

any_executor_base(any_executor_base&& other) ASIO_NOEXCEPT
    : object_fns_(other.object_fns_),
      target_fns_(other.target_fns_)
  {
    other.object_fns_ = object_fns_table<void>();
    other.target_fns_ = target_fns_table<void>();
    object_fns_->move(*this, other);
    other.target_ = 0;
  }